

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O1

S2CellId __thiscall S2CellId::FromDebugString(S2CellId *this,string_view str)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  S2CellId id;
  S2CellId local_28;
  
  pcVar4 = str.ptr_;
  if ((int)str.ptr_ - 0x21U < 0xffffffe1) {
    return (S2CellId)0;
  }
  bVar1 = (byte)this->id_;
  if ((0xf9 < (byte)(bVar1 - 0x36)) && (*(char *)((long)&this->id_ + 1) == '/')) {
    local_28.id_ = (ulong)bVar1 << 0x3d | 0x1000000000000000;
    bVar5 = (char *)0x2 < pcVar4;
    if ((bVar5) && (bVar1 = *(byte *)((long)&this->id_ + 2), (bVar1 & 0xfc) == 0x30)) {
      pcVar2 = (char *)0x3;
      do {
        pcVar3 = pcVar2;
        local_28 = child(&local_28,bVar1 - 0x30);
        if (pcVar4 == pcVar3) break;
        bVar1 = pcVar3[(long)&this->id_];
        pcVar2 = pcVar3 + 1;
      } while ((bVar1 & 0xfc) == 0x30);
      bVar5 = pcVar3 < pcVar4;
    }
    if (!bVar5) {
      return (S2CellId)local_28.id_;
    }
  }
  return (S2CellId)0;
}

Assistant:

S2CellId S2CellId::FromDebugString(absl::string_view str) {
  // This function is reasonably efficient, but is only intended for use in
  // tests.
  int level = static_cast<int>(str.size() - 2);
  if (level < 0 || level > S2CellId::kMaxLevel) return S2CellId::None();
  int face = str[0] - '0';
  if (face < 0 || face > 5 || str[1] != '/') return S2CellId::None();
  S2CellId id = S2CellId::FromFace(face);
  for (int i = 2; i < str.size(); ++i) {
    int child_pos = str[i] - '0';
    if (child_pos < 0 || child_pos > 3) return S2CellId::None();
    id = id.child(child_pos);
  }
  return id;
}